

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void av1_init_level_info(AV1_COMP *cpi)

{
  void *__s;
  int iVar1;
  AV1_COMP *cpi_00;
  ulong uVar2;
  long *in_RDI;
  AV1LevelSpec *spec;
  DECODER_MODEL *this_model;
  AV1_LEVEL level;
  int pic_size;
  int height;
  int upscaled_width;
  AV1_COMMON *cm;
  FrameWindowBuffer *frame_window_buffer;
  AV1LevelStats *level_stats;
  AV1LevelSpec *level_spec;
  AV1LevelInfo *this_level_info;
  int op_index;
  byte local_45;
  int iVar3;
  int iVar4;
  long *plVar5;
  int local_c;
  
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    __s = *(void **)(*in_RDI + 0x5ab8 + (long)local_c * 8);
    if (__s != (void *)0x0) {
      memset(__s,0,0x107d0);
      *(undefined1 *)((long)__s + 0x38) = 0x1f;
      *(undefined4 *)((long)__s + 0xc) = 0x7fffffff;
      *(undefined4 *)((long)__s + 0x10) = 0x7fffffff;
      *(undefined4 *)((long)__s + 0x18) = 0x7fffffff;
      *(undefined4 *)((long)__s + 0x1c) = 0x7fffffff;
      *(undefined4 *)((long)__s + 0x14) = 1;
      *(undefined8 *)((long)__s + 0x30) = 0x4197d78400000000;
      cpi_00 = (AV1_COMP *)((long)__s + 0x88);
      *(undefined4 *)((long)__s + 0x3088) = 0;
      *(undefined4 *)((long)__s + 0x308c) = 0;
      plVar5 = in_RDI + 0x77f0;
      iVar4 = (int)in_RDI[0x77f9];
      iVar3 = *(int *)((long)in_RDI + 0x3bfbc);
      iVar1 = iVar4 * iVar3;
      for (local_45 = 0; local_45 < 0x1c; local_45 = local_45 + 1) {
        uVar2 = (ulong)local_45;
        if (((av1_level_defs[uVar2].max_h_size < iVar4) ||
            (av1_level_defs[uVar2].max_v_size < iVar3)) ||
           (av1_level_defs[uVar2].max_picture_size < iVar1)) {
          *(undefined1 *)((long)__s + (ulong)local_45 * 0x7b0 + 0x3090) = 7;
        }
        else {
          decoder_model_init(cpi_00,(AV1_LEVEL)((ulong)plVar5 >> 0x38),(int)plVar5,
                             (DECODER_MODEL *)CONCAT44(iVar4,iVar3));
        }
      }
    }
  }
  return;
}

Assistant:

void av1_init_level_info(AV1_COMP *cpi) {
  for (int op_index = 0; op_index < MAX_NUM_OPERATING_POINTS; ++op_index) {
    AV1LevelInfo *const this_level_info =
        cpi->ppi->level_params.level_info[op_index];
    if (!this_level_info) continue;
    memset(this_level_info, 0, sizeof(*this_level_info));
    AV1LevelSpec *const level_spec = &this_level_info->level_spec;
    level_spec->level = SEQ_LEVEL_MAX;
    AV1LevelStats *const level_stats = &this_level_info->level_stats;
    level_stats->min_cropped_tile_width = INT_MAX;
    level_stats->min_cropped_tile_height = INT_MAX;
    level_stats->min_frame_width = INT_MAX;
    level_stats->min_frame_height = INT_MAX;
    level_stats->tile_width_is_valid = 1;
    level_stats->min_cr = 1e8;

    FrameWindowBuffer *const frame_window_buffer =
        &this_level_info->frame_window_buffer;
    frame_window_buffer->num = 0;
    frame_window_buffer->start = 0;

    const AV1_COMMON *const cm = &cpi->common;
    const int upscaled_width = cm->superres_upscaled_width;
    const int height = cm->height;
    const int pic_size = upscaled_width * height;
    for (AV1_LEVEL level = SEQ_LEVEL_2_0; level < SEQ_LEVELS; ++level) {
      DECODER_MODEL *const this_model = &this_level_info->decoder_models[level];
      const AV1LevelSpec *const spec = &av1_level_defs[level];
      if (upscaled_width > spec->max_h_size || height > spec->max_v_size ||
          pic_size > spec->max_picture_size) {
        // Turn off decoder model for this level as the frame size already
        // exceeds level constraints.
        this_model->status = DECODER_MODEL_DISABLED;
      } else {
        decoder_model_init(cpi, level, op_index, this_model);
      }
    }
  }
}